

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManComputeCuts(Of_Man_t *p)

{
  int a;
  int iVar1;
  bool bVar2;
  int local_1c;
  int iFanin;
  int i;
  Gia_Obj_t *pObj;
  Of_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->pGia->nObjs) {
      _iFanin = Gia_ManObj(p->pGia,local_1c);
      bVar2 = _iFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(_iFanin);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsBuf(_iFanin);
      if (iVar1 == 0) {
        Of_ObjMergeOrder(p,local_1c);
      }
      else {
        iVar1 = Gia_ObjFaninId0(_iFanin,local_1c);
        a = Of_ObjCutFlow(p,iVar1);
        Of_ObjSetCutFlow(p,local_1c,a);
        iVar1 = Of_ObjCutDelay(p,iVar1);
        Of_ObjSetCutDelay(p,local_1c,iVar1);
      }
    }
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->pGia->nObjs) {
      _iFanin = Gia_ManObj(p->pGia,local_1c);
      bVar2 = _iFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(_iFanin);
    if ((iVar1 != 0) && (iVar1 = Gia_ObjIsBuf(_iFanin), iVar1 == 0)) {
      Of_ManLiftCuts(p,local_1c);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Of_ManComputeCuts( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iFanin;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0(pObj, i);
            Of_ObjSetCutFlow( p, i,  Of_ObjCutFlow(p, iFanin) );
            Of_ObjSetCutDelay( p, i, Of_ObjCutDelay(p, iFanin) );
        }
        else
            Of_ObjMergeOrder( p, i );
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( !Gia_ObjIsBuf(pObj) )
            Of_ManLiftCuts( p, i );
}